

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::FullyConnectedLayer::calcInducedLocalField(FullyConnectedLayer *this,Array *inputs)

{
  element_type *peVar1;
  size_t sVar2;
  float *m_begin;
  size_t sVar3;
  float *b_begin;
  float *x_end;
  float *x_begin;
  float *m_end;
  float *b_end;
  
  std::valarray<float>::operator=
            (&this->inducedLocalField,
             (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  peVar1 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  sVar2 = peVar1->_M_size;
  m_begin = peVar1->_M_data;
  m_end = m_begin + sVar2;
  if (sVar2 == 0) {
    m_end = (float *)0x0;
    m_begin = (float *)0x0;
  }
  sVar2 = inputs->_M_size;
  x_begin = inputs->_M_data;
  x_end = x_begin + sVar2;
  if (sVar2 == 0) {
    x_begin = (float *)0x0;
  }
  sVar3 = (this->inducedLocalField)._M_size;
  if (sVar2 == 0) {
    x_end = (float *)0x0;
  }
  b_begin = (this->inducedLocalField)._M_data;
  b_end = b_begin + sVar3;
  if (sVar3 == 0) {
    b_end = (float *)0x0;
    b_begin = (float *)0x0;
  }
  internal::gemv<float*,float_const*,float*>(m_begin,m_end,x_begin,x_end,b_begin,b_end);
  return;
}

Assistant:

void calcInducedLocalField(const Array &inputs) {
        inducedLocalField = *bias; // will be added and overwritten
        internal::gemv(
             std::begin(*weights), std::end(*weights), std::begin(inputs),
             std::end(inputs), std::begin(inducedLocalField),
             std::end(inducedLocalField));
    }